

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setListPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,ListReader value,
          BuilderArena *orphanArena,bool canonical)

{
  char *pcVar1;
  long lVar2;
  BuilderArena *pBVar3;
  word *pwVar4;
  ListElementCount LVar5;
  StructPointerCount SVar6;
  ListElementCount LVar7;
  SegmentBuilder *pSVar8;
  word *pwVar9;
  void *pvVar10;
  ulong uVar11;
  ElementCount index;
  WirePointer *pWVar12;
  word *pwVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  byte *__src;
  long lVar18;
  ulong uVar19;
  StructPointerCount SVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  byte *pbVar26;
  bool bVar27;
  SegmentAnd<capnp::word_*> SVar28;
  AllocateResult AVar29;
  WirePointer *local_100;
  ulong local_e8;
  unsigned_long totalSize;
  StructReader element;
  Fault f;
  unsigned_long newTotalSize;
  
  LVar5 = value.elementCount;
  SVar6 = value.structPointerCount;
  if (0x7ffffff80 < (ulong)value.step * (ulong)value.elementCount) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
              ((Fault *)&element,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x735,FAILED,(char *)0x0,"\"encountered impossibly long struct list ListReader\"",
               (char (*) [51])"encountered impossibly long struct list ListReader");
    kj::_::Debug::Fault::fatal((Fault *)&element);
  }
  uVar21 = (ulong)value.step * (ulong)value.elementCount + 0x3f >> 6;
  totalSize = uVar21;
  if (value.elementSize == INLINE_COMPOSITE) {
    uVar23 = value.structDataSize >> 6;
    uVar19 = uVar21;
    SVar20 = value.structPointerCount;
    local_e8 = (ulong)uVar23;
    if (canonical) {
      index = 0;
      uVar19 = 0;
      local_e8 = 0;
      while( true ) {
        SVar20 = (StructPointerCount)uVar19;
        uVar11 = uVar19 & 0xffff;
        if (index == LVar5) break;
        ListReader::getStructElement(&element,&value,index);
        pvVar10 = (void *)((ulong)(element.dataSize >> 3) + (long)element.data);
        uVar24 = (element.dataSize >> 3) + 7;
        do {
          uVar17 = uVar24;
          if (pvVar10 <= element.data) break;
          pcVar1 = (char *)((long)pvVar10 - 1);
          pvVar10 = (void *)((long)pvVar10 - 1);
          uVar24 = uVar17 - 1;
        } while (*pcVar1 == '\0');
        uVar17 = uVar17 >> 3;
        if (uVar17 <= (ushort)local_e8) {
          uVar17 = (uint)(ushort)local_e8;
        }
        local_e8 = (ulong)uVar17;
        lVar25 = (ulong)element.pointerCount << 3;
        do {
          lVar15 = lVar25;
          pWVar12 = (WirePointer *)((long)&((element.pointers)->offsetAndKind).value + lVar15);
          if (pWVar12 <= element.pointers) break;
          lVar25 = lVar15 + -8;
        } while (pWVar12[-1].field_1.upper32Bits == 0 && pWVar12[-1].offsetAndKind.value == 0);
        uVar19 = lVar15 >> 3;
        if (lVar15 >> 3 <= (long)uVar11) {
          uVar19 = uVar11;
        }
        index = index + 1;
      }
      uVar19 = (ulong)value.elementCount * (uVar11 + (local_e8 & 0xffff));
      element.segment = (SegmentReader *)&newTotalSize;
      element.capTable = (CapTableReader *)&totalSize;
      element.data = anon_var_dwarf_16d42d;
      element.pointers = (WirePointer *)0x5;
      bVar27 = uVar19 - uVar21 == 0;
      element.dataSize = CONCAT31(element.dataSize._1_3_,uVar19 < uVar21 || bVar27);
      newTotalSize = uVar19;
      if (uVar19 >= uVar21 && !bVar27) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x772,FAILED,"newTotalSize <= totalSize","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long_&> *)&element);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    uVar24 = (int)uVar19 + 1;
    pWVar12 = ref;
    totalSize = uVar19;
    if (orphanArena == (BuilderArena *)0x0) {
      if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
        zeroObject(segment,capTable,ref);
      }
      pwVar13 = segment->pos;
      if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                 ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar13)) >> 3 <
           (long)(ulong)uVar24) || (segment->pos = pwVar13 + uVar24, pwVar13 == (word *)0x0)) {
        pBVar3 = (BuilderArena *)(segment->super_SegmentReader).arena;
        uVar24 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                           ((int)uVar19 + 2,(anon_class_1_0_00000001 *)&element);
        AVar29 = BuilderArena::allocate(pBVar3,uVar24);
        pWVar12 = (WirePointer *)AVar29.words;
        pSVar8 = AVar29.segment;
        (ref->offsetAndKind).value =
             (int)AVar29.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       (pSVar8->super_SegmentReader).id.value;
        (pWVar12->offsetAndKind).value = 1;
        SVar28.value = (word *)(pWVar12 + 1);
        SVar28.segment = pSVar8;
      }
      else {
        SVar28.value = pwVar13;
        SVar28.segment = segment;
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)pwVar13 - (long)ref) >> 1) & 0xfffffffc) - 3;
      }
    }
    else {
      SVar28 = (SegmentAnd<capnp::word_*>)BuilderArena::allocate(orphanArena,uVar24);
      (ref->offsetAndKind).value = 0xfffffffd;
    }
    LVar5 = value.elementCount;
    pwVar9 = SVar28.value;
    (pWVar12->field_1).upper32Bits = (int)totalSize * 8 + 7;
    *(ListElementCount *)&pwVar9->content = value.elementCount * 4;
    *(short *)((long)&pwVar9->content + 4) = (short)local_e8;
    *(StructPointerCount *)((long)&pwVar9->content + 6) = SVar20;
    pwVar13 = pwVar9 + 1;
    uVar11 = (ulong)(uint)((int)(local_e8 & 0xffff) << 3);
    uVar21 = (ulong)uVar23 & 0xffff;
    lVar22 = (long)&pwVar9[1].content + uVar11;
    uVar19 = (ulong)(uint)((int)uVar21 * 8);
    pbVar26 = value.ptr + uVar19;
    lVar25 = uVar19 + (ulong)SVar6 * 8;
    lVar15 = -8 - (long)pbVar26;
    __src = value.ptr;
    for (LVar7 = 0; LVar7 != LVar5; LVar7 = LVar7 + 1) {
      if ((short)local_e8 != 0) {
        memcpy(pwVar13,__src,uVar11);
      }
      lVar16 = lVar15;
      for (lVar14 = 0; (ulong)SVar20 * 8 != lVar14; lVar14 = lVar14 + 8) {
        lVar18 = (long)(*(int *)(pbVar26 + lVar14) >> 2);
        lVar2 = lVar14 + lVar18 * 8;
        if (value.segment == (SegmentReader *)0x0) {
          pwVar9 = (word *)(pbVar26 + lVar2 + 8);
        }
        else {
          pwVar4 = ((value.segment)->ptr).ptr;
          pwVar9 = pwVar4 + ((value.segment)->ptr).size_;
          if (((long)&pwVar4->content + lVar16 >> 3 <= lVar18) &&
             (lVar18 <= (long)&pwVar9->content + lVar16 >> 3)) {
            pwVar9 = (word *)(pbVar26 + lVar2 + 8);
          }
        }
        copyPointer(SVar28.segment,capTable,(WirePointer *)(lVar14 + lVar22),value.segment,
                    value.capTable,(WirePointer *)(pbVar26 + lVar14),pwVar9,value.nestingLimit,
                    (BuilderArena *)0x0,canonical);
        lVar16 = lVar16 + -8;
      }
      pwVar13 = pwVar13 + (local_e8 & 0xffff) + (ulong)SVar20;
      __src = __src + (ulong)SVar6 * 8 + uVar21 * 8;
      lVar22 = lVar22 + uVar11 + (ulong)SVar20 * 8;
      pbVar26 = pbVar26 + lVar25;
      lVar15 = lVar15 - lVar25;
    }
  }
  else {
    pWVar12 = ref;
    if (orphanArena == (BuilderArena *)0x0) {
      if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
        zeroObject(segment,capTable,ref);
      }
      local_100 = (WirePointer *)segment->pos;
      if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                 ((segment->super_SegmentReader).ptr.size_ * 8 - (long)local_100)) >> 3 <
           (long)uVar21) ||
         (segment->pos = (word *)(local_100 + uVar21), local_100 == (WirePointer *)0x0)) {
        pBVar3 = (BuilderArena *)(segment->super_SegmentReader).arena;
        uVar23 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                           ((SegmentWordCount)uVar21 + 1,(anon_class_1_0_00000001 *)&element);
        AVar29 = BuilderArena::allocate(pBVar3,uVar23);
        pWVar12 = (WirePointer *)AVar29.words;
        segment = AVar29.segment;
        (ref->offsetAndKind).value =
             (int)AVar29.words - *(int *)&(segment->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       (segment->super_SegmentReader).id.value;
        (pWVar12->offsetAndKind).value = 1;
        local_100 = pWVar12 + 1;
      }
      else {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)local_100 - (long)ref) >> 1) & 0xfffffffc) - 3;
      }
    }
    else {
      AVar29 = BuilderArena::allocate(orphanArena,(SegmentWordCount)uVar21);
      local_100 = (WirePointer *)AVar29.words;
      segment = AVar29.segment;
      (ref->offsetAndKind).value = 0xfffffffd;
    }
    SVar28.value = (word *)local_100;
    SVar28.segment = segment;
    uVar21 = (ulong)value.elementCount;
    if (value.elementSize == 6) {
      (pWVar12->field_1).upper32Bits = value.elementCount * 8 | 6;
      lVar25 = 8;
      for (lVar15 = -8; uVar21 * 8 + lVar15 != -8; lVar15 = lVar15 + -8) {
        lVar16 = (long)(*(int *)(value.ptr + lVar25 + -8) >> 2);
        lVar22 = lVar25 + lVar16 * 8;
        if (value.segment == (SegmentReader *)0x0) {
          pwVar13 = (word *)(value.ptr + lVar22);
        }
        else {
          pwVar9 = ((value.segment)->ptr).ptr;
          pwVar13 = pwVar9 + ((value.segment)->ptr).size_;
          if (((long)pwVar9 + (lVar15 - (long)value.ptr) >> 3 <= lVar16) &&
             (lVar16 <= (long)pwVar13 + (lVar15 - (long)value.ptr) >> 3)) {
            pwVar13 = (word *)(value.ptr + lVar22);
          }
        }
        copyPointer(segment,capTable,local_100,value.segment,value.capTable,
                    (WirePointer *)(value.ptr + lVar25 + -8),pwVar13,value.nestingLimit,
                    (BuilderArena *)0x0,canonical);
        local_100 = local_100 + 1;
        lVar25 = lVar25 + 8;
      }
    }
    else {
      (pWVar12->field_1).upper32Bits = value.elementCount * 8 | (uint)value.elementSize;
      uVar21 = value.step * uVar21;
      if (0x7ffffffc7 < uVar21) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                  ((Fault *)&element,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x74b,FAILED,(char *)0x0,"\"encountered impossibly long data ListReader\"",
                   (char (*) [44])"encountered impossibly long data ListReader");
        kj::_::Debug::Fault::fatal((Fault *)&element);
      }
      uVar19 = uVar21 >> 3;
      if (7 < uVar21) {
        memcpy(local_100,value.ptr,uVar19);
        uVar21 = (ulong)value.step * (ulong)value.elementCount;
      }
      if ((uVar21 & 7) != 0) {
        *(byte *)((long)&(local_100->offsetAndKind).value + uVar19) =
             ~(-1 << (sbyte)(uVar21 & 7)) & value.ptr[uVar19];
      }
    }
  }
  return SVar28;
}

Assistant:

static SegmentAnd<word*> setListPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, ListReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto totalSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
        roundBitsUpToWords(upgradeBound<uint64_t>(value.elementCount) * value.step),
        []() { KJ_FAIL_ASSERT("encountered impossibly long struct list ListReader"); });

    if (value.elementSize != ElementSize::INLINE_COMPOSITE) {
      // List of non-structs.
      word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::LIST, orphanArena);

      if (value.elementSize == ElementSize::POINTER) {
        // List of pointers.
        ref->listRef.set(ElementSize::POINTER, value.elementCount);
        for (auto i: kj::zeroTo(value.elementCount * (ONE * POINTERS / ELEMENTS))) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(ptr) + i,
                      value.segment, value.capTable,
                      reinterpret_cast<const WirePointer*>(value.ptr) + i,
                      value.nestingLimit, nullptr, canonical);
        }
      } else {
        // List of data.
        ref->listRef.set(value.elementSize, value.elementCount);

        auto wholeByteSize =
          assertMax(MAX_SEGMENT_WORDS * BYTES_PER_WORD,
            upgradeBound<uint64_t>(value.elementCount) * value.step / BITS_PER_BYTE,
            []() { KJ_FAIL_ASSERT("encountered impossibly long data ListReader"); });
        copyMemory(reinterpret_cast<byte*>(ptr), value.ptr, wholeByteSize);
        auto leftoverBits =
          (upgradeBound<uint64_t>(value.elementCount) * value.step) % BITS_PER_BYTE;
        if (leftoverBits > ZERO * BITS) {
          // We need to copy a partial byte.
          uint8_t mask = (1 << unbound(leftoverBits / BITS)) - 1;
          *((reinterpret_cast<byte*>(ptr)) + wholeByteSize) = mask & *(value.ptr + wholeByteSize);
        }
      }

      return { segment, ptr };
    } else {
      // List of structs.
      StructDataWordCount declDataSize = value.structDataSize / BITS_PER_WORD;
      StructPointerCount declPointerCount = value.structPointerCount;

      StructDataWordCount dataSize = ZERO * WORDS;
      StructPointerCount ptrCount = ZERO * POINTERS;

      if (canonical) {
        for (auto i: kj::zeroTo(value.elementCount)) {
          auto element = value.getStructElement(i);

          // Truncate the data section
          auto data = element.getDataSectionAsBlob();
          auto end = data.end();
          while (end > data.begin() && end[-1] == 0) --end;
          dataSize = kj::max(dataSize, roundBytesUpToWords(
              intervalLength(data.begin(), end, MAX_STRUCT_DATA_WORDS * BYTES_PER_WORD)));

          // Truncate pointer section
          const WirePointer* ptr = element.pointers + element.pointerCount;
          while (ptr > element.pointers && ptr[-1].isNull()) --ptr;
          ptrCount = kj::max(ptrCount,
              intervalLength(element.pointers, ptr, MAX_STRUCT_POINTER_COUNT));
        }
        auto newTotalSize = (dataSize + upgradeBound<uint64_t>(ptrCount) * WORDS_PER_POINTER)
            / ELEMENTS * value.elementCount;
        KJ_ASSERT(newTotalSize <= totalSize);  // we've only removed data!
        totalSize = assumeMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(newTotalSize);
      } else {
        dataSize = declDataSize;
        ptrCount = declPointerCount;
      }

      KJ_DASSERT(value.structDataSize % BITS_PER_WORD == ZERO * BITS);
      word* ptr = allocate(ref, segment, capTable, totalSize + POINTER_SIZE_IN_WORDS,
                           WirePointer::LIST, orphanArena);
      ref->listRef.setInlineComposite(totalSize);

      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, value.elementCount);
      tag->structRef.set(dataSize, ptrCount);
      word* dst = ptr + POINTER_SIZE_IN_WORDS;

      const word* src = reinterpret_cast<const word*>(value.ptr);
      for (auto i KJ_UNUSED: kj::zeroTo(value.elementCount)) {
        copyMemory(dst, src, dataSize);
        dst += dataSize;
        src += declDataSize;

        for (auto j: kj::zeroTo(ptrCount)) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(dst) + j,
              value.segment, value.capTable, reinterpret_cast<const WirePointer*>(src) + j,
              value.nestingLimit, nullptr, canonical);
        }
        dst += ptrCount * WORDS_PER_POINTER;
        src += declPointerCount * WORDS_PER_POINTER;
      }

      return { segment, ptr };
    }
  }